

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::DataSourceDescriptor::DataSourceDescriptor(DataSourceDescriptor *this)

{
  DataSourceDescriptor *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__DataSourceDescriptor_009c0a48;
  ::std::__cxx11::string::string((string *)&this->name_);
  this->id_ = 0;
  this->will_notify_on_stop_ = false;
  this->will_notify_on_start_ = false;
  this->handles_incremental_state_clear_ = false;
  ::std::__cxx11::string::string((string *)&this->gpu_counter_descriptor_);
  ::std::__cxx11::string::string((string *)&this->track_event_descriptor_);
  ::std::__cxx11::string::string((string *)&this->ftrace_descriptor_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<9UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

DataSourceDescriptor::DataSourceDescriptor() = default;